

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

int cvui::internal::iarea(int theX,int theY,int theWidth,int theHeight)

{
  bool bVar1;
  int iVar2;
  cvui_context_t *pcVar3;
  int iVar4;
  String local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  pcVar3 = getContext(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (pcVar3->mouse).position.x;
  if ((iVar4 < theWidth + theX && theX <= iVar4) &&
     (iVar4 = (pcVar3->mouse).position.y, theY <= iVar4)) {
    bVar1 = iVar4 < theHeight + theY;
  }
  else {
    bVar1 = false;
  }
  iVar4 = ((byte)~(pcVar3->mouse).anyButton.pressed & 1) * 2 + 2;
  if (!bVar1) {
    iVar4 = 5;
  }
  iVar2 = 3;
  if (((pcVar3->mouse).anyButton.justReleased & 1U) == 0) {
    iVar2 = iVar4;
  }
  if (!bVar1) {
    iVar2 = 5;
  }
  return iVar2;
}

Assistant:

int iarea(int theX, int theY, int theWidth, int theHeight) {
		cvui_mouse_t& aMouse = internal::getContext().mouse;

		// By default, return that the mouse is out of the interaction area.
		int aRet = cvui::OUT;

		// Check if the mouse is over the interaction area.
		bool aMouseIsOver = cv::Rect(theX, theY, theWidth, theHeight).contains(aMouse.position);

		if (aMouseIsOver) {
			if (aMouse.anyButton.pressed) {
				aRet = cvui::DOWN;
			} else {
				aRet = cvui::OVER;
			}
		}

		// Tell if the button was clicked or not
		if (aMouseIsOver && aMouse.anyButton.justReleased) {
			aRet = cvui::CLICK;
		}

		return aRet;
	}